

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void __thiscall MdlOptions::MdlOptions(MdlOptions *this,int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  const_iterator cVar3;
  any *paVar4;
  ostream *poVar5;
  bool bVar6;
  string usage;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option>_>
  e;
  positional_options_description p;
  options_description desc;
  variables_map vm;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [40];
  pointer local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  pointer local_298;
  pointer local_290;
  pointer local_288;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [2];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_240 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_220 [32];
  long **local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  long *local_170;
  long local_160 [2];
  long *local_150 [2];
  long local_140 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_128 [24];
  void *local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  long local_f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_e8 [24];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  long local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  this->_standalone = true;
  local_2d8._24_8_ = &this->_display_driver;
  local_2a8 = (pointer)&(this->_display_driver).field_2;
  (this->_display_driver)._M_dataplus._M_p = (pointer)local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8._24_8_,"ncurses","");
  local_298 = &this->_input_file;
  local_2b0 = (pointer)&(this->_input_file).field_2;
  (this->_input_file)._M_dataplus._M_p = (pointer)local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
  local_2a0 = &this->_output_file;
  local_2d8._32_8_ = &(this->_output_file).field_2;
  (this->_output_file)._M_dataplus._M_p = (pointer)local_2d8._32_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
  local_290 = (pointer)local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"Usage: mdl [OPTIONS] <input-file>","");
  boost::program_options::options_description::options_description
            ((options_description *)local_150,(string *)&local_290,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_270._M_allocated_capacity = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_280 + 0x10,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"display-driver,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-parser,p",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-file,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output-file,o",(char *)ptVar2);
  boost::program_options::options_description_easy_init::operator()(pcVar1,"version");
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_188);
  boost::program_options::positional_options_description::add((char *)&local_188,0x1341a7);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)(local_280 + 0x10),argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((options_description *)(local_280 + 0x10));
  local_200 = local_150;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)(local_280 + 0x10));
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_2e8,
             (basic_command_line_parser<char> *)(local_280 + 0x10));
  boost::program_options::store((basic_parsed_options *)local_2e8,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_2e8);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_220);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_280 + 0x10));
  local_270._M_allocated_capacity = (size_type)local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_280 + 0x10),"help","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)(local_280 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_allocated_capacity != local_260) {
    operator_delete((void *)local_270._M_allocated_capacity,local_260[0]._M_allocated_capacity + 1);
  }
  if (cVar3._M_node == &local_b8) {
    local_270._M_allocated_capacity = (size_type)local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_280 + 0x10),"version","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)(local_280 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_allocated_capacity != local_260) {
      operator_delete((void *)local_270._M_allocated_capacity,local_260[0]._M_allocated_capacity + 1
                     );
    }
    if (cVar3._M_node == &local_b8) {
      if (local_98 == 0) {
        bVar6 = true;
      }
      else {
        local_270._M_allocated_capacity = (size_type)local_260;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_280 + 0x10),"input-file","");
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)(local_280 + 0x10));
        bVar6 = cVar3._M_node == &local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_allocated_capacity != local_260) {
          operator_delete((void *)local_270._M_allocated_capacity,
                          local_260[0]._M_allocated_capacity + 1);
        }
      }
      if (!bVar6) {
        local_2e8._0_8_ = (pointer)local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"input-file","");
        paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                                  ((string *)local_d0);
        boost::any_cast<std::__cxx11::string_const&>(paVar4);
        std::__cxx11::string::_M_assign((string *)local_298);
        if ((pointer)local_2e8._0_8_ != (pointer)local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        local_2e8._0_8_ = (pointer)local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"display-driver","");
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)local_2e8);
        if ((pointer)local_2e8._0_8_ != (pointer)local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        if (cVar3._M_node == &local_b8) {
          std::__cxx11::string::_M_replace
                    (local_2d8._24_8_,0,(char *)(this->_display_driver)._M_string_length,0x13400a);
        }
        else {
          local_2e8._0_8_ = (pointer)local_2d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"display-driver","");
          paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                                    ((string *)local_d0);
          boost::any_cast<std::__cxx11::string_const&>(paVar4);
          std::__cxx11::string::_M_assign((string *)local_2d8._24_8_);
          if ((pointer)local_2e8._0_8_ != (pointer)local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
        }
        local_2e8._0_8_ = (pointer)local_2d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"output-file","");
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)local_2e8);
        if ((pointer)local_2e8._0_8_ != (pointer)local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        if (cVar3._M_node != &local_b8) {
          local_2e8._0_8_ = (pointer)local_2d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"output-file","");
          paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                                    ((string *)local_d0);
          boost::any_cast<std::__cxx11::string_const&>(paVar4);
          std::__cxx11::string::_M_assign((string *)local_2a0);
          if ((pointer)local_2e8._0_8_ != (pointer)local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
        }
        local_d0[0] = Paragraph::operator[];
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(local_90);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
        ::~_Rb_tree(local_c0);
        if (local_170 != local_160) {
          operator_delete(local_170,local_160[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_188);
        std::
        vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
        ::~vector(local_e8);
        if (local_110 != (void *)0x0) {
          operator_delete(local_110,local_f0 - (long)local_110);
          local_110 = (void *)0x0;
          local_108 = 0;
          local_100 = 0;
          local_f8 = 0;
          local_f0 = 0;
        }
        std::
        vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
        ::~vector(local_128);
        if (local_150[0] != local_140) {
          operator_delete(local_150[0],local_140[0] + 1);
        }
        if (local_290 != (pointer)local_280) {
          operator_delete(local_290,(ulong)(local_280._0_8_ + 1));
        }
        return;
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_290,(long)local_288);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"mdl: Missing an input file",0x1a);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mdl (version: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.1.3",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,(options_description *)local_150);
  }
  exit(0);
}

Assistant:

MdlOptions::MdlOptions(int argc, const char *const *argv) :
	_standalone(true),
	_display_driver("ncurses"),
	_input_file(""),
	_output_file("") {
	// Set Boost program options up
	const string usage("Usage: mdl [OPTIONS] <input-file>");
	po::options_description desc(usage);
	desc.add_options()
		("help,h", "produce help message and exit")
		("display-driver,d", po::value<string>(), "set display driver")
		("input-parser,p", po::value<string>(), "set input parser")
		("input-file,i", po::value<string>(), "input file to be used")
		("output-file,o", po::value<string>(), "output file")
		("version", "print the version information and exit");
	po::positional_options_description p;
	p.add("input-file", -1);
	po::variables_map vm;
	
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(p).run(), vm);
	} catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option> > e) {
		cerr << "mdl: " << e.what() << endl;
		exit(1);
	}
	
	if (vm.count("help")) {
		cout << desc;
		exit(0);
	} else if (vm.count("version")) {
		cout << "mdl (version: " << MDL_VERSION_STRING << ")" << endl;
		exit(0);
	} else if (vm.empty() or vm.count("input-file") == 0) {
		cout << usage << endl;
		cout << "mdl: Missing an input file" << endl;
		exit(0);
	}

	_input_file = vm["input-file"].as<string>();
	
	if (vm.count("display-driver")) {
		_display_driver = vm["display-driver"].as<string>();
	} else {
		_display_driver = "ncurses";
	}

	if (vm.count("output-file")) {
		_output_file = vm["output-file"].as<string>();
	}
}